

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_mct_validation
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  long local_40;
  opj_tccp_t *l_tccp;
  opj_tcp_t *l_tcp;
  OPJ_UINT32 l_nb_tiles;
  OPJ_UINT32 j;
  OPJ_UINT32 i;
  OPJ_BOOL l_is_valid;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  j = 1;
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x1db0,
                  "OPJ_BOOL opj_j2k_mct_validation(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_stream == (opj_stream_private_t *)0x0) {
    __assert_fail("p_stream != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x1db1,
                  "OPJ_BOOL opj_j2k_mct_validation(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x1db2,
                  "OPJ_BOOL opj_j2k_mct_validation(opj_j2k_t *, opj_stream_private_t *, opj_event_mgr_t *)"
                 );
  }
  if (((p_j2k->m_cp).rsiz & 0x8200) == 0x8200) {
    l_tccp = (opj_tccp_t *)(p_j2k->m_cp).tcps;
    for (l_nb_tiles = 0; l_nb_tiles < (p_j2k->m_cp).th * (p_j2k->m_cp).tw;
        l_nb_tiles = l_nb_tiles + 1) {
      if (l_tccp->cblksty == 2) {
        local_40 = *(long *)&l_tccp[5].stepsizes[0x15].mant;
        j = *(long *)&l_tccp[5].stepsizes[0x1b].mant != 0 & j;
        for (l_tcp._4_4_ = 0; l_tcp._4_4_ < p_j2k->m_private_image->numcomps;
            l_tcp._4_4_ = l_tcp._4_4_ + 1) {
          j = (((*(uint *)(local_40 + 0x14) & 1) != 0 ^ 0xffU) & 1) & j;
          local_40 = local_40 + 0x438;
        }
      }
      l_tccp = (opj_tccp_t *)&l_tccp[5].stepsizes[0x21].mant;
    }
  }
  return j;
}

Assistant:

static OPJ_BOOL opj_j2k_mct_validation(opj_j2k_t * p_j2k,
                                       opj_stream_private_t *p_stream,
                                       opj_event_mgr_t * p_manager)
{
    OPJ_BOOL l_is_valid = OPJ_TRUE;
    OPJ_UINT32 i, j;

    /* preconditions */
    assert(p_j2k != 00);
    assert(p_stream != 00);
    assert(p_manager != 00);

    OPJ_UNUSED(p_stream);
    OPJ_UNUSED(p_manager);

    if ((p_j2k->m_cp.rsiz & 0x8200) == 0x8200) {
        OPJ_UINT32 l_nb_tiles = p_j2k->m_cp.th * p_j2k->m_cp.tw;
        opj_tcp_t * l_tcp = p_j2k->m_cp.tcps;

        for (i = 0; i < l_nb_tiles; ++i) {
            if (l_tcp->mct == 2) {
                opj_tccp_t * l_tccp = l_tcp->tccps;
                l_is_valid &= (l_tcp->m_mct_coding_matrix != 00);

                for (j = 0; j < p_j2k->m_private_image->numcomps; ++j) {
                    l_is_valid &= !(l_tccp->qmfbid & 1);
                    ++l_tccp;
                }
            }
            ++l_tcp;
        }
    }

    return l_is_valid;
}